

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O2

node * __thiscall
YAML::detail::node_data::get(node_data *this,node *key,shared_memory_holder *pMemory)

{
  value vVar1;
  BadSubscript *this_00;
  pointer ppVar2;
  node *value;
  
  vVar1 = this->m_type;
  if ((vVar1 < Scalar) || (vVar1 == Sequence)) {
    convert_to_map(this,pMemory);
  }
  else if (vVar1 == Scalar) {
    this_00 = (BadSubscript *)__cxa_allocate_exception(0x40);
    BadSubscript::BadSubscript<YAML::detail::node>(this_00,&this->m_mark,key);
    __cxa_throw(this_00,&BadSubscript::typeinfo,BadConversion::~BadConversion);
  }
  ppVar2 = (this->m_map).
           super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVar2 == (this->m_map).
                  super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      value = memory_holder::create_node
                        ((pMemory->
                         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
      insert_map_pair(this,key,value);
      return value;
    }
    if ((ppVar2->first->m_pRef).
        super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (key->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    break;
    ppVar2 = ppVar2 + 1;
  }
  return ppVar2->second;
}

Assistant:

node& node_data::get(node& key, const shared_memory_holder& pMemory) {
  switch (m_type) {
    case NodeType::Map:
      break;
    case NodeType::Undefined:
    case NodeType::Null:
    case NodeType::Sequence:
      convert_to_map(pMemory);
      break;
    case NodeType::Scalar:
      throw BadSubscript(m_mark, key);
  }

  for (const auto& it : m_map) {
    if (it.first->is(key))
      return *it.second;
  }

  node& value = pMemory->create_node();
  insert_map_pair(key, value);
  return value;
}